

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_promise_resolve_thenable_job(JSContext *ctx,int argc,JSValue *argv)

{
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue func_obj;
  JSValue JVar1;
  int iVar2;
  JSContext *in_RDI;
  JSValue JVar3;
  JSValue JVar4;
  JSValue error;
  JSValue res;
  JSValue args [2];
  JSValue then;
  JSValue thenable;
  JSValue promise;
  JSContext *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  int64_t in_stack_ffffffffffffff40;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined1 in_stack_ffffffffffffff58 [16];
  undefined1 auVar5 [12];
  JSValue in_stack_ffffffffffffff68;
  JSValueUnion in_stack_ffffffffffffff78;
  JSValueUnion in_stack_ffffffffffffff80;
  int64_t in_stack_ffffffffffffff88;
  JSValue *in_stack_ffffffffffffffa0;
  undefined4 local_10;
  undefined4 uStack_c;
  undefined8 local_8;
  
  auVar5 = in_stack_ffffffffffffff58._4_12_;
  JVar3.tag = in_stack_ffffffffffffff88;
  JVar3.u.ptr = in_stack_ffffffffffffff80.ptr;
  iVar2 = js_create_resolving_functions
                    ((JSContext *)in_stack_ffffffffffffff78.ptr,
                     (JSValue *)in_stack_ffffffffffffff68.tag,JVar3);
  if (iVar2 < 0) {
    local_10 = 0;
    local_8 = 6;
  }
  else {
    JVar4.tag = (int64_t)in_stack_ffffffffffffff80.ptr;
    JVar4.u.ptr = in_stack_ffffffffffffff78.ptr;
    JVar3 = JS_Call(auVar5._4_8_,JVar4,in_stack_ffffffffffffff68,auVar5._0_4_,
                    in_stack_ffffffffffffffa0);
    local_b8 = JVar3.u;
    local_b0 = JVar3.tag;
    iVar2 = JS_IsException(JVar3);
    if (iVar2 != 0) {
      JVar4 = JS_GetException(in_RDI);
      in_stack_ffffffffffffff38 = 0;
      in_stack_ffffffffffffff40 = 3;
      func_obj.tag = local_b0;
      func_obj.u.float64 = local_b8;
      JVar3 = JS_Call((JSContext *)JVar4.tag,func_obj,JVar3,JVar4.u._4_4_,in_stack_ffffffffffffffa0)
      ;
      local_b8 = JVar3.u;
      local_b0 = JVar3.tag;
      v.u._4_4_ = in_stack_ffffffffffffff3c;
      v.u.int32 = in_stack_ffffffffffffff38;
      v.tag = in_stack_ffffffffffffff40;
      JS_FreeValue(in_stack_ffffffffffffff30,v);
    }
    v_00.u._4_4_ = in_stack_ffffffffffffff3c;
    v_00.u.int32 = in_stack_ffffffffffffff38;
    v_00.tag = in_stack_ffffffffffffff40;
    JS_FreeValue(in_stack_ffffffffffffff30,v_00);
    v_01.u._4_4_ = in_stack_ffffffffffffff3c;
    v_01.u.int32 = in_stack_ffffffffffffff38;
    v_01.tag = in_stack_ffffffffffffff40;
    JS_FreeValue(in_stack_ffffffffffffff30,v_01);
    local_10 = (int32_t)local_b8;
    uStack_c = local_b8._4_4_;
    local_8 = local_b0;
  }
  JVar1.u._4_4_ = uStack_c;
  JVar1.u.int32 = local_10;
  JVar1.tag = local_8;
  return JVar1;
}

Assistant:

static JSValue js_promise_resolve_thenable_job(JSContext *ctx,
                                               int argc, JSValueConst *argv)
{
    JSValueConst promise, thenable, then;
    JSValue args[2], res;

#ifdef DUMP_PROMISE
    printf("js_promise_resolve_thenable_job\n");
#endif
    assert(argc == 3);
    promise = argv[0];
    thenable = argv[1];
    then = argv[2];
    if (js_create_resolving_functions(ctx, args, promise) < 0)
        return JS_EXCEPTION;
    res = JS_Call(ctx, then, thenable, 2, (JSValueConst *)args);
    if (JS_IsException(res)) {
        JSValue error = JS_GetException(ctx);
        res = JS_Call(ctx, args[1], JS_UNDEFINED, 1, (JSValueConst *)&error);
        JS_FreeValue(ctx, error);
    }
    JS_FreeValue(ctx, args[0]);
    JS_FreeValue(ctx, args[1]);
    return res;
}